

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall
chrono::ChArchiveOut::out<chrono::geometry::ChCone>
          (ChArchiveOut *this,ChNameValue<chrono::geometry::ChCone> *bVal)

{
  byte bVar1;
  byte flags;
  ChExceptionArchive *this_00;
  long *plVar2;
  size_type *psVar3;
  bool already_stored;
  size_t obj_ID;
  ChValueSpecific<chrono::geometry::ChCone> specVal;
  allocator local_a2;
  bool local_a1;
  size_t local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  ChValueSpecific<chrono::geometry::ChCone> local_58;
  
  local_a0 = 0;
  bVar1 = bVal->_flags;
  flags = bVar1;
  if ((bVar1 & 1) != 0) {
    PutPointer(this,bVal->_value,&local_a1,&local_a0);
    if (local_a1 == true) {
      this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_98,bVal->_name,&local_a2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                     "Cannot serialize tracked object \'",&local_98);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
      psVar3 = (size_type *)(plVar2 + 2);
      local_78._M_dataplus._M_p = (pointer)*plVar2;
      if ((size_type *)local_78._M_dataplus._M_p == psVar3) {
        local_78.field_2._M_allocated_capacity = *psVar3;
        local_78.field_2._8_8_ = plVar2[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar3;
      }
      local_78._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      ChExceptionArchive::ChExceptionArchive(this_00,&local_78);
      __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChException::~ChException);
    }
    flags = bVal->_flags;
  }
  ChValueSpecific<chrono::geometry::ChCone>::ChValueSpecific
            (&local_58,bVal->_value,bVal->_name,flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xc])(this,&local_58,(ulong)(bVar1 & 1),local_a0);
  local_58.super_ChValue._vptr_ChValue = (_func_int **)&PTR__ChValue_00b03028;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.super_ChValue._name._M_dataplus._M_p != &local_58.super_ChValue._name.field_2) {
    operator_delete(local_58.super_ChValue._name._M_dataplus._M_p,
                    local_58.super_ChValue._name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void out (ChNameValue<T> bVal) {
          bool tracked = false;
          size_t obj_ID =0;
          if (bVal.flags() & NVP_TRACK_OBJECT)
          {
              bool already_stored; 
              T* mptr = &bVal.value();
              PutPointer(mptr, already_stored, obj_ID);
              if (already_stored) 
                  {throw (ChExceptionArchive( "Cannot serialize tracked object '" + std::string(bVal.name()) + "' by value, AFTER already serialized by pointer."));}
              tracked = true;
          }
          ChValueSpecific< T > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out(
              specVal,
              tracked, 
              obj_ID);
      }